

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  int64_t iVar6;
  void *pvVar7;
  long lVar8;
  int64_t iVar9;
  void *pvVar10;
  size_t min;
  wchar_t wVar11;
  
  if (best_bid < L'!') {
    pvVar3 = a->format->data;
    uVar5 = __archive_read_seek(a,0,2);
    wVar11 = L'\0';
    if (0 < (long)uVar5) {
      min = 0x4000;
      if (uVar5 < 0x4000) {
        min = uVar5;
      }
      iVar6 = __archive_read_seek(a,(long)-(int)min,2);
      wVar11 = L'\0';
      if (-1 < iVar6) {
        wVar11 = L'\0';
        pvVar7 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (pvVar7 != (void *)0x0) {
          wVar11 = L'\0';
          uVar5 = 0;
LAB_0049a08f:
          while (iVar4 = (int)uVar5, iVar4 <= (int)min + -0x16) {
            lVar8 = (long)iVar4;
            cVar1 = *(char *)((long)pvVar7 + lVar8 + 3);
            if (cVar1 != '\x05') {
              if (cVar1 == '\x06') {
                if ((((*(int *)((long)pvVar7 + lVar8) == 0x6054b50) &&
                     (*(short *)((long)pvVar7 + lVar8 + 4) == 0)) &&
                    (*(short *)((long)pvVar7 + lVar8 + 6) == 0)) &&
                   ((*(short *)((long)pvVar7 + lVar8 + 10) == *(short *)((long)pvVar7 + lVar8 + 8)
                    && (uVar2 = *(uint *)((long)pvVar7 + lVar8 + 0x10), uVar5 = (ulong)uVar2,
                       (long)(ulong)(*(int *)((long)pvVar7 + lVar8 + 0xc) + uVar2) <= lVar8 + iVar6)
                    ))) {
LAB_0049a1a4:
                  *(ulong *)((long)pvVar3 + 0x40) = uVar5;
                  return L' ';
                }
                goto LAB_0049a104;
              }
              if (cVar1 != '\a') goto code_r0x0049a0b1;
              if (((((*(int *)((long)pvVar7 + lVar8) == 0x7064b50) &&
                    (*(int *)((long)pvVar7 + lVar8 + 4) == 0)) &&
                   (*(int *)((long)pvVar7 + lVar8 + 0x10) == 1)) &&
                  ((((iVar9 = __archive_read_seek(a,*(int64_t *)((long)pvVar7 + lVar8 + 8),0),
                     -1 < iVar9 &&
                     (pvVar10 = __archive_read_ahead(a,0x38,(ssize_t *)0x0), pvVar10 != (void *)0x0)
                     ) && ((0xffffffffffffc036 < *(long *)((long)pvVar10 + 4) - 0x3ff5U &&
                           ((pvVar10 = __archive_read_ahead
                                                 (a,*(long *)((long)pvVar10 + 4) + 0xc,
                                                  (ssize_t *)0x0), pvVar10 != (void *)0x0 &&
                            (*(int *)((long)pvVar10 + 0x10) == 0)))))) &&
                   (*(int *)((long)pvVar10 + 0x14) == 0)))) &&
                 (*(long *)((long)pvVar10 + 0x18) == *(long *)((long)pvVar10 + 0x20))) {
                uVar5 = *(ulong *)((long)pvVar10 + 0x30);
                goto LAB_0049a1a4;
              }
              goto LAB_0049a184;
            }
LAB_0049a104:
            uVar5 = (ulong)(iVar4 + 1);
          }
        }
      }
    }
  }
  else {
    wVar11 = L'\xffffffff';
  }
  return wVar11;
code_r0x0049a0b1:
  uVar5 = lVar8 + 3;
  if (cVar1 != 'P') {
    if (cVar1 == 'K') {
      uVar5 = (ulong)(iVar4 + 2);
    }
    else {
LAB_0049a184:
      uVar5 = (ulong)(iVar4 + 4);
    }
  }
  goto LAB_0049a08f;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) or Zip64 locator
	 * record (which begins with PK\006\007) */
	tail = zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* TODO: Rework this to search backwards from the end.  We
	 * normally expect the EOCD record to be at the very end, so
	 * that should be significantly faster.  Tricky part: Make
	 * sure we still prefer the Zip64 locator if it's present. */
	for (i = 0; i <= tail - 22;) {
		switch (p[i + 3]) {
		case 'P': i += 3; break;
		case 'K': i += 2; break;
		case 005: i += 1; break;
		case 006:
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i, current_offset + i);
				if (ret > 0)
					return (ret);
			}
			i += 1; /* Look for PK\006\007 next */
			break;
		case 007:
			if (memcmp(p + i, "PK\006\007", 4) == 0) {
				int ret = read_zip64_eocd(a, zip, p + i);
				if (ret > 0)
					return (ret);
			}
			i += 4;
			break;
		default: i += 4; break;
		}
	}
	return 0;
}